

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O1

void __thiscall DBaseDecal::Destroy(DBaseDecal *this)

{
  DBaseDecal *pDVar1;
  
  pDVar1 = this->WallPrev;
  if (pDVar1 == (DBaseDecal *)0x0) {
    if (this->Side != (side_t *)0x0) {
      this->Side->AttachedDecals = this->WallNext;
    }
  }
  else {
    pDVar1->WallNext = this->WallNext;
  }
  if (this->WallNext != (DBaseDecal *)0x0) {
    this->WallNext->WallPrev = pDVar1;
  }
  this->WallNext = (DBaseDecal *)0x0;
  this->WallPrev = (DBaseDecal *)0x0;
  DThinker::Destroy(&this->super_DThinker);
  return;
}

Assistant:

void DBaseDecal::Remove ()
{
	if (WallPrev == nullptr)
	{
		if (Side != nullptr) Side->AttachedDecals = WallNext;
	}
	else WallPrev->WallNext = WallNext;

	if (WallNext != nullptr) WallNext->WallPrev = WallPrev;

	WallPrev = nullptr;
	WallNext = nullptr;
}